

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taiwncal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TaiwanCalendar::handleGetLimit
          (TaiwanCalendar *this,UCalendarDateFields field,ELimitType limitType)

{
  ELimitType limitType_local;
  UCalendarDateFields field_local;
  TaiwanCalendar *this_local;
  
  if (field == UCAL_ERA) {
    if ((limitType == UCAL_LIMIT_MINIMUM) || (limitType == UCAL_LIMIT_GREATEST_MINIMUM)) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ =
         GregorianCalendar::handleGetLimit(&this->super_GregorianCalendar,field,limitType);
  }
  return this_local._4_4_;
}

Assistant:

int32_t TaiwanCalendar::handleGetLimit(UCalendarDateFields field, ELimitType limitType) const
{
    if(field == UCAL_ERA) {
        if(limitType == UCAL_LIMIT_MINIMUM || limitType == UCAL_LIMIT_GREATEST_MINIMUM) {
            return BEFORE_MINGUO;
        } else {
            return MINGUO;
        }
    } else {
        return GregorianCalendar::handleGetLimit(field,limitType);
    }
}